

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

string * __thiscall
cmOutputConverter::ConvertToOutputForExisting
          (string *__return_storage_ptr__,cmOutputConverter *this,RelativeRoot remote,string *local,
          OutputFormat format)

{
  char *pcVar1;
  allocator local_89;
  string local_88;
  char *local_58;
  char *remotePath;
  string result;
  OutputFormat format_local;
  string *local_local;
  RelativeRoot remote_local;
  cmOutputConverter *this_local;
  
  result.field_2._12_4_ = format;
  Convert((string *)&remotePath,this,remote,local,format,true);
  pcVar1 = GetRelativeRootPath(this,remote);
  local_58 = pcVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,pcVar1,&local_89);
  ConvertToOutputForExistingCommon
            (__return_storage_ptr__,this,&local_88,(string *)&remotePath,result.field_2._12_4_);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string((string *)&remotePath);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmOutputConverter::ConvertToOutputForExisting(RelativeRoot remote,
                                              const std::string& local,
                                              OutputFormat format) const
{
  // Perform standard conversion.
  std::string result = this->Convert(remote, local, format, true);

  // Consider short-path.
  const char* remotePath = this->GetRelativeRootPath(remote);
  return this->ConvertToOutputForExistingCommon(remotePath, result, format);
}